

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::
statement<char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int,char_const(&)[4]>
          (CompilerGLSL *this,char (*ts) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [3],
          char **ts_5,char (*ts_6) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,char (*ts_8) [8],
          char **ts_9,char (*ts_10) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_11,char (*ts_12) [2]
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_13,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_14,char (*ts_15) [4]
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_16,
          char (*ts_17) [2],uint *ts_18,char (*ts_19) [4])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint uVar2;
  char (*ts_19_00) [4];
  string local_50;
  
  ts_19_00 = (char (*) [4])0x2fcfe7;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar1) {
    this_00 = this->redirect_statement;
    if (this_00 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      if (this->indent != 0) {
        uVar2 = 0;
        do {
          StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->indent);
      }
      statement_inner<char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int,char_const(&)[4]>
                (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12,ts_13,ts_14,
                 ts_15,ts_16,ts_17,ts_18,ts_19);
      local_50._M_dataplus._M_p._0_1_ = 10;
      StringStream<4096UL,_4096UL>::append(&this->buffer,(char *)&local_50,1);
      return;
    }
    join<char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int,char_const(&)[4]>
              (&local_50,(spirv_cross *)ts,(char (*) [2])ts_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,
               (char (*) [2])ts_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,
               (char (*) [3])ts_5,(char **)ts_6,(char (*) [4])ts_7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_8,
               (char (*) [8])ts_9,(char **)ts_10,(char (*) [2])ts_11,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_12,
               (char (*) [2])ts_13,ts_14,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_15,
               (char (*) [4])ts_16,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_17,
               (char (*) [2])ts_18,(uint *)ts_19,ts_19_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
    }
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}